

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

char * config_find_string_fallback(map *config_map,char *key,char *fallback)

{
  natwm_error nVar1;
  char *local_28;
  char *string;
  
  local_28 = (char *)0x0;
  nVar1 = config_find_string(config_map,key,&local_28);
  if (nVar1 == NO_ERROR) {
    fallback = local_28;
  }
  return fallback;
}

Assistant:

const char *config_find_string_fallback(const struct map *config_map, const char *key,
                                        const char *fallback)
{
        const char *string = NULL;

        if (config_find_string(config_map, key, &string) != NO_ERROR) {
                return fallback;
        }

        return string;
}